

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O3

int __thiscall CVmDynFuncVMIfc::validate_obj(CVmDynFuncVMIfc *this,tctarg_obj_id_t obj)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((obj != 0) && (uVar1 = 0, obj < (uint)((int)G_obj_table_X.pages_used_ << 0xc))) {
    uVar1 = ~*(uint *)&G_obj_table_X.pages_[obj >> 0xc][obj & 0xfff].field_0x14 & 1;
  }
  return uVar1;
}

Assistant:

virtual int validate_obj(tctarg_obj_id_t obj)
    {
        VMGLOB_PTR(vmg);
        return G_obj_table->is_obj_id_valid(obj);
    }